

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O1

QByteArray * QByteArray::toUpper_helper(QByteArray *__return_storage_ptr__,QByteArray *a)

{
  byte *pbVar1;
  long lVar2;
  Data *pDVar3;
  byte bVar4;
  iterator pcVar5;
  long lVar6;
  byte bVar7;
  byte *pbVar8;
  bool bVar9;
  
  pbVar1 = (byte *)(a->d).ptr;
  lVar2 = (a->d).size;
  bVar9 = lVar2 == 0;
  if (!bVar9) {
    bVar4 = 0xe5 < (byte)(*pbVar1 + 0x85) & (*pbVar1 & 0x20) >> 5;
    pbVar8 = pbVar1;
    lVar6 = lVar2;
    while (bVar4 == 0) {
      lVar6 = lVar6 + -1;
      bVar9 = lVar6 == 0;
      if (bVar9) goto LAB_00308bad;
      pbVar8 = pbVar8 + 1;
      bVar4 = 0xe5 < (byte)(*pbVar8 + 0x85) & (*pbVar8 & 0x20) >> 5;
    }
    if (!bVar9) {
      (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      (__return_storage_ptr__->d).ptr = &DAT_aaaaaaaaaaaaaaaa;
      pDVar3 = (a->d).d;
      (__return_storage_ptr__->d).d = pDVar3;
      (__return_storage_ptr__->d).ptr = (char *)pbVar1;
      (__return_storage_ptr__->d).size = lVar2;
      if (pDVar3 != (Data *)0x0) {
        LOCK();
        (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pcVar5 = begin(__return_storage_ptr__);
      lVar2 = (__return_storage_ptr__->d).size;
      if ((long)pbVar8 - (long)pbVar1 == lVar2) {
        return __return_storage_ptr__;
      }
      do {
        bVar4 = pbVar8[(long)pcVar5 - (long)pbVar1];
        bVar7 = bVar4 & 0xdf;
        if (0x19 < (byte)(bVar4 + 0x9f)) {
          bVar7 = bVar4;
        }
        pbVar8[(long)pcVar5 - (long)pbVar1] = bVar7;
        pbVar8 = pbVar8 + 1;
      } while (pbVar1 + lVar2 != pbVar8);
      return __return_storage_ptr__;
    }
  }
LAB_00308bad:
  pDVar3 = (a->d).d;
  (__return_storage_ptr__->d).d = pDVar3;
  (__return_storage_ptr__->d).ptr = (char *)pbVar1;
  (__return_storage_ptr__->d).size = lVar2;
  if (pDVar3 != (Data *)0x0) {
    LOCK();
    (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  return __return_storage_ptr__;
}

Assistant:

QByteArray QByteArray::toUpper_helper(const QByteArray &a)
{
    return toCase_template(a, asciiUpper);
}